

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_attribute * __thiscall pugi::xml_attribute::operator=(xml_attribute *this,bool rhs)

{
  bool rhs_local;
  xml_attribute *this_local;
  
  set_value(this,rhs);
  return this;
}

Assistant:

PUGI__FN xml_attribute& xml_attribute::operator=(bool rhs)
	{
		set_value(rhs);
		return *this;
	}